

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void rollback_forward_seqnum(void)

{
  fdb_status fVar1;
  void *meta;
  fdb_kvs_handle *in_stack_fffffffffffff9b8;
  void *in_stack_fffffffffffff9c0;
  fdb_iterator *in_stack_fffffffffffff9c8;
  size_t in_stack_fffffffffffff9d8;
  void *in_stack_fffffffffffff9e0;
  size_t in_stack_fffffffffffff9e8;
  void *in_stack_fffffffffffff9f0;
  fdb_kvs_handle *in_stack_fffffffffffff9f8;
  fdb_doc *in_stack_fffffffffffffa10;
  fdb_kvs_handle *in_stack_fffffffffffffa18;
  fdb_doc **in_stack_fffffffffffffa30;
  fdb_iterator *in_stack_fffffffffffffa38;
  fdb_seqnum_t in_stack_fffffffffffffae0;
  fdb_kvs_handle **in_stack_fffffffffffffae8;
  fdb_kvs_info *in_stack_fffffffffffffb20;
  fdb_kvs_handle *in_stack_fffffffffffffb28;
  fdb_kvs_config *in_stack_fffffffffffffb60;
  char *in_stack_fffffffffffffb68;
  fdb_kvs_handle **in_stack_fffffffffffffb70;
  fdb_file_handle *in_stack_fffffffffffffb78;
  fdb_config *in_stack_fffffffffffffbd8;
  char *in_stack_fffffffffffffbe0;
  fdb_file_handle **in_stack_fffffffffffffbe8;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_kvs_info info;
  fdb_kvs_handle *mirror_kv1;
  fdb_kvs_handle *kv1;
  fdb_iterator *it;
  fdb_file_handle *dbfile;
  char local_178 [5];
  char setop [3];
  char keybuf [256];
  int rb2_seqnum;
  int rb1_seqnum;
  int n;
  int i;
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  fdb_kvs_open(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
               in_stack_fffffffffffffb60);
  fdb_kvs_open(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
               in_stack_fffffffffffffb60);
  for (rb1_seqnum = 0; rb1_seqnum < 0x65; rb1_seqnum = rb1_seqnum + 1) {
    sprintf(local_178,"key%d",(ulong)(uint)rb1_seqnum);
    meta = (void *)0x113c9d;
    strlen(local_178);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
                   (size_t)in_stack_fffffffffffff9b8,meta,0,(void *)0x113cca,
                   (size_t)in_stack_fffffffffffff9e0);
    fdb_set(mirror_kv1,*(fdb_doc **)(&stack0xfffffffffffff9b8 + (long)rb1_seqnum * 8));
    strlen(local_178);
    fdb_set_kv(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
               in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
  }
  fdb_del(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff9b8,'\0');
  fdb_get_kvs_info(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
  for (rb1_seqnum = 0; rb1_seqnum < 100; rb1_seqnum = rb1_seqnum + 1) {
    fdb_del(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff9b8,'\0');
  fdb_get_kvs_info(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
  for (rb1_seqnum = 0; rb1_seqnum < 100; rb1_seqnum = rb1_seqnum + 1) {
    *(undefined1 *)(*(long *)(&stack0xfffffffffffff9b8 + (long)rb1_seqnum * 8) + 0x48) = 0;
    fdb_set(mirror_kv1,*(fdb_doc **)(&stack0xfffffffffffff9b8 + (long)rb1_seqnum * 8));
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff9b8,'\0');
  fVar1 = fdb_rollback(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xa51);
    rollback_forward_seqnum::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xa51,"void rollback_forward_seqnum()");
    }
  }
  fdb_get_kvs_info(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
  if (info.doc_count != 1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xa54);
    rollback_forward_seqnum::__test_pass = 0;
    if (info.doc_count != 1) {
      __assert_fail("info.deleted_count == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xa54,"void rollback_forward_seqnum()");
    }
  }
  fVar1 = fdb_rollback(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  if (fVar1 != FDB_RESULT_NO_DB_INSTANCE) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xa58);
    rollback_forward_seqnum::__test_pass = 0;
    if (fVar1 != FDB_RESULT_NO_DB_INSTANCE) {
      __assert_fail("status == FDB_RESULT_NO_DB_INSTANCE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xa58,"void rollback_forward_seqnum()");
    }
  }
  fVar1 = fdb_iterator_sequence_init((fdb_kvs_handle *)info.file,(fdb_iterator **)&kv1,0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xa5b);
    rollback_forward_seqnum::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xa5b,"void rollback_forward_seqnum()");
    }
  }
  do {
    fVar1 = fdb_iterator_get(in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xa5f);
      rollback_forward_seqnum::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xa5f,"void rollback_forward_seqnum()");
      }
    }
    if (lRam0000000000000028 == 0x65) {
      fVar1 = fdb_get_metaonly(mirror_kv1,(fdb_doc *)0x0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xa66);
        rollback_forward_seqnum::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xa66,"void rollback_forward_seqnum()");
        }
      }
      if ((bRam0000000000000048 & 1) != 1) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xa67);
        rollback_forward_seqnum::__test_pass = 0;
        if ((bRam0000000000000048 & 1) != 1) {
          __assert_fail("rdoc->deleted == true",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xa67,"void rollback_forward_seqnum()");
        }
      }
    }
    else {
      fVar1 = fdb_get_metaonly_byseq(mirror_kv1,(fdb_doc *)0x0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xa62);
        rollback_forward_seqnum::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xa62,"void rollback_forward_seqnum()");
        }
      }
      if ((bRam0000000000000048 & 1) != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xa63);
        rollback_forward_seqnum::__test_pass = 0;
        if ((bRam0000000000000048 & 1) != 0) {
          __assert_fail("rdoc->deleted == false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xa63,"void rollback_forward_seqnum()");
        }
      }
    }
    fdb_doc_free((fdb_doc *)0x1142c8);
    fVar1 = fdb_iterator_next((fdb_iterator *)in_stack_fffffffffffff9b8);
  } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
  for (rb1_seqnum = 0; rb1_seqnum < 0x65; rb1_seqnum = rb1_seqnum + 1) {
    fdb_doc_free((fdb_doc *)0x11430b);
  }
  fdb_iterator_close(in_stack_fffffffffffff9c8);
  fdb_kvs_close(in_stack_fffffffffffff9b8);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffff9b8);
  fdb_shutdown();
  memleak_end();
  if (rollback_forward_seqnum::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","rollback forward seqnum");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","rollback forward seqnum");
  }
  return;
}

Assistant:

void rollback_forward_seqnum()
{

    TEST_INIT();
    memleak_start();

    int r;
    int i, n=100;
    int rb1_seqnum, rb2_seqnum;
    char keybuf[256];
    char setop[3];
    fdb_file_handle *dbfile;
    fdb_iterator *it;
    fdb_kvs_handle *kv1, *mirror_kv1;
    fdb_kvs_info info;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_doc **doc = alca(fdb_doc*, n+1);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fconfig.wal_threshold = n;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 5;
    fconfig.block_reusing_threshold = 0;

    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    fdb_kvs_open(dbfile, &mirror_kv1, NULL, &kvs_config);


    // set n docs within both dbs
    for(i=0;i<=n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            NULL, 0, NULL, 0);
        fdb_set(kv1, doc[i]);
        fdb_set_kv(mirror_kv1, keybuf, strlen(keybuf), setop, 3);
    } // last set should have caused a wal flush

    fdb_del(kv1, doc[n]);

    // commit and save seqnum1
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    fdb_get_kvs_info(kv1, &info);
    rb1_seqnum = info.last_seqnum;

    // delete all docs in kv1
    for(i=0;i<n;++i){
        fdb_del(kv1, doc[i]);
    }

    // commit and save seqnum2
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_get_kvs_info(kv1, &info);
    rb2_seqnum = info.last_seqnum;

    // sets again
    for(i=0;i<n;++i){
        doc[i]->deleted = false;
        fdb_set(kv1, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // rollback to first seqnum
    status = fdb_rollback(&kv1, rb1_seqnum);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_get_kvs_info(kv1, &info);
    TEST_CHK(info.deleted_count == 1);

    // rollback to second seqnum
    status = fdb_rollback(&kv1, rb2_seqnum);
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    status = fdb_iterator_sequence_init(mirror_kv1, &it, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    do {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (rdoc->seqnum != (uint64_t)n+1) {
            status = fdb_get_metaonly_byseq(kv1, rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CHK(rdoc->deleted == false);
        } else {
            status = fdb_get_metaonly(kv1, rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CHK(rdoc->deleted == true);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while(fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);

    for (i=0;i<=n;++i){
        fdb_doc_free(doc[i]);
    }
    fdb_iterator_close(it);
    fdb_kvs_close(kv1);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();

    TEST_RESULT("rollback forward seqnum");
}